

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

void __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::expand(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
         *this)

{
  uint uVar1;
  UnresolvedSplitRecord *pUVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  UnresolvedSplitRecord *pUVar5;
  UnresolvedSplitRecord *pUVar6;
  UnresolvedSplitRecord *pUVar7;
  void **head;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = this->_capacity;
  pUVar2 = this->_data;
  uVar9 = 4;
  if (uVar1 != 0) {
    uVar9 = (ulong)(uVar1 * 2);
  }
  uVar8 = (uint)uVar9;
  this->_capacity = uVar8;
  if (uVar8 == 0) {
    pUVar5 = (UnresolvedSplitRecord *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar8 < 3) {
    pUVar5 = (UnresolvedSplitRecord *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar8 < 5) {
    pUVar5 = (UnresolvedSplitRecord *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pUVar5 = (UnresolvedSplitRecord *)::operator_new(uVar9 << 4,0x10);
  }
  this->_data = pUVar5;
  this->_data1 = pUVar5 + -1;
  uVar9 = (ulong)this->_size;
  if (uVar9 != 0) {
    pUVar5 = pUVar5 + uVar9;
    pUVar7 = pUVar2 + uVar9;
    do {
      pUVar6 = pUVar7 + -1;
      uVar4 = *(undefined4 *)&pUVar6->field_0x4;
      uVar3 = pUVar7[-1].original._content;
      pUVar5[-1].var = pUVar6->var;
      *(undefined4 *)&pUVar5[-1].field_0x4 = uVar4;
      pUVar5[-1].original._content = uVar3;
      pUVar5 = pUVar5 + -1;
      pUVar7 = pUVar6;
    } while (pUVar5 != this->_data);
  }
  if (pUVar2 != (UnresolvedSplitRecord *)0x0) {
    if (uVar1 == 1) {
      *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar2;
    }
    else if (uVar1 == 0) {
      *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pUVar2;
    }
    else if (uVar1 < 3) {
      *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pUVar2;
    }
    else if (uVar1 == 3) {
      *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pUVar2;
    }
    else {
      if (4 < uVar1) {
        operator_delete(pUVar2,0x10);
        return;
      }
      *(undefined8 *)pUVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pUVar2;
    }
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }